

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_mutex.c
# Opt level: O0

int s_mutex_lock(s_awaiter_t *__awaiter_dummy__,s_mutex_t *mutex)

{
  long *in_FS_OFFSET;
  int ret;
  s_mutex_t *mutex_local;
  s_awaiter_t *__awaiter_dummy___local;
  
  if ((mutex->locked & 1U) == 0) {
    mutex->locked = true;
    __awaiter_dummy___local._4_4_ = 0;
  }
  else {
    s_mutex_add_to_waiting_list(mutex);
    s_list_detach(*(s_list_t **)(*in_FS_OFFSET + -0x40));
    s_list_attach(&mutex->wait_list,*(s_list_t **)(*in_FS_OFFSET + -0x40));
    s_task_next(__awaiter_dummy__);
    __awaiter_dummy___local._4_4_ = 0;
    if ((*(byte *)(*(long *)(*in_FS_OFFSET + -0x40) + 0x50) & 1) != 0) {
      __awaiter_dummy___local._4_4_ = -1;
    }
    *(undefined1 *)(*(long *)(*in_FS_OFFSET + -0x40) + 0x50) = 0;
  }
  return __awaiter_dummy___local._4_4_;
}

Assistant:

int s_mutex_lock(__async__, s_mutex_t *mutex) {
    if(mutex->locked) {
        int ret;
        /* Put current task to the mutex's waiting list */
        s_mutex_add_to_waiting_list(mutex);
        s_list_detach(&g_globals.current_task->node);   /* no need, for safe */
        s_list_attach(&mutex->wait_list, &g_globals.current_task->node);
        s_task_next(__await__);

        ret = (g_globals.current_task->waiting_cancelled ? -1 : 0);
        g_globals.current_task->waiting_cancelled = false;
        return ret;
    }
    else {
        mutex->locked = true;
        return 0;
    }
}